

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

string * __thiscall
httplib::Request::get_header_value_abi_cxx11_
          (string *__return_storage_ptr__,Request *this,char *key,size_t id)

{
  char *__s;
  allocator<char> local_29;
  size_t local_28;
  size_t id_local;
  char *key_local;
  Request *this_local;
  
  local_28 = id;
  id_local = (size_t)key;
  key_local = (char *)this;
  this_local = (Request *)__return_storage_ptr__;
  __s = detail::get_header_value(&this->headers,key,id,"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_29)
  ;
  std::allocator<char>::~allocator(&local_29);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Request::get_header_value(const char* key, size_t id) const {
        return detail::get_header_value(headers, key, id, "");
    }